

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularArray.hpp
# Opt level: O3

void __thiscall Lib::TriangularArray<int>::setSide(TriangularArray<int> *this,size_t side)

{
  int *piVar1;
  ulong uVar2;
  int *__s;
  ulong uVar3;
  int *res;
  
  this->_2sideMinus1 = side * 2 - 1;
  uVar2 = (side * 2 + 2) * side * 2 >> 3;
  if (this->_capacity < uVar2) {
    uVar3 = this->_capacity * 2;
    if (uVar3 <= uVar2) {
      uVar3 = uVar2;
    }
    uVar2 = uVar3 * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      __s = (int *)FixedSizeAllocator<8UL>::alloc
                             ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar2 < 0x11) {
      __s = (int *)FixedSizeAllocator<16UL>::alloc
                             ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar2 < 0x19) {
      __s = (int *)FixedSizeAllocator<24UL>::alloc
                             ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar2 < 0x21) {
      __s = (int *)FixedSizeAllocator<32UL>::alloc
                             ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar2 < 0x31) {
      __s = (int *)FixedSizeAllocator<48UL>::alloc
                             ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar2 < 0x41) {
      __s = (int *)FixedSizeAllocator<64UL>::alloc
                             ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      __s = (int *)::operator_new(uVar2,0x10);
    }
    piVar1 = this->_data;
    if (piVar1 != (int *)0x0) {
      uVar2 = this->_capacity * 4 + 0xf & 0xfffffffffffffff0;
      if (uVar2 == 0) {
        *(undefined8 *)piVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = piVar1;
      }
      else if (uVar2 < 0x11) {
        *(undefined8 *)piVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = piVar1;
      }
      else if (uVar2 < 0x19) {
        *(undefined8 *)piVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = piVar1;
      }
      else if (uVar2 < 0x21) {
        *(undefined8 *)piVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = piVar1;
      }
      else if (uVar2 < 0x31) {
        *(undefined8 *)piVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = piVar1;
      }
      else if (uVar2 < 0x41) {
        *(undefined8 *)piVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = piVar1;
      }
      else {
        operator_delete(piVar1,0x10);
      }
    }
    this->_capacity = uVar3;
    memset(__s,0,uVar3 * 4);
    this->_data = __s;
  }
  return;
}

Assistant:

void setSide(size_t side)
  {
    ASS_G(side,0);
    _2sideMinus1=2*side-1;
    if(dataSize()>_capacity) {
      size_t newCapacity=std::max(_capacity*2, dataSize());
      void * mem=ALLOC_KNOWN(newCapacity*sizeof(T), "Lib::TriangularArray");

      array_delete(_data, _capacity);
      DEALLOC_KNOWN(_data, _capacity*sizeof(T), "Lib::TriangularArray");

      _capacity=newCapacity;
      _data=array_new<T>(mem, _capacity);
    }
  }